

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crpt.c
# Opt level: O0

int RSA_blinding_on(RSA *rsa,BN_CTX *ctx)

{
  BN_BLINDING *pBVar1;
  bool bVar2;
  int ret;
  uint local_14;
  
  if (rsa[1].engine != (ENGINE *)0x0) {
    RSA_blinding_off(rsa);
  }
  pBVar1 = RSA_setup_blinding((RSA *)rsa,(BN_CTX *)ctx);
  rsa[1].engine = (ENGINE *)pBVar1;
  bVar2 = rsa[1].engine != (ENGINE *)0x0;
  if (bVar2) {
    *(uint *)((long)&rsa->mt_blinding + 4) = *(uint *)((long)&rsa->mt_blinding + 4) | 8;
    *(uint *)((long)&rsa->mt_blinding + 4) = *(uint *)((long)&rsa->mt_blinding + 4) & 0xffffff7f;
  }
  local_14 = (uint)bVar2;
  return local_14;
}

Assistant:

int RSA_blinding_on(RSA *rsa, BN_CTX *ctx)
{
    int ret = 0;

    if (rsa->blinding != NULL)
        RSA_blinding_off(rsa);

    rsa->blinding = RSA_setup_blinding(rsa, ctx);
    if (rsa->blinding == NULL)
        goto err;

    rsa->flags |= RSA_FLAG_BLINDING;
    rsa->flags &= ~RSA_FLAG_NO_BLINDING;
    ret = 1;
 err:
    return ret;
}